

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall
ThreadPoolTest_initialDefault_Test::~ThreadPoolTest_initialDefault_Test
          (ThreadPoolTest_initialDefault_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ThreadPoolTest, initialDefault) {
	thread_pool pool;
	std::this_thread::sleep_for(10ms);

	EXPECT_EQ(pool.threads(), std::thread::hardware_concurrency());
	std::this_thread::sleep_for(10ms);
	EXPECT_EQ(pool.active(), 0U);

	pool.join();

	EXPECT_EQ(pool.active(), 0U);
	EXPECT_EQ(pool.threads(), 0U);
}